

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O1

DatabaseInstance * __thiscall
duckdb::ColumnDataCheckpointData::GetDatabase(ColumnDataCheckpointData *this)

{
  optional_ptr<duckdb::ColumnData,_true>::CheckValid(&this->col_data);
  return ((this->col_data).ptr)->info->db->db;
}

Assistant:

DatabaseInstance &ColumnDataCheckpointData::GetDatabase() {
	return col_data->GetDatabase();
}